

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtSuppFindFirst(int Supp)

{
  uint uVar1;
  uint uVar2;
  
  if (0 < Supp) {
    for (uVar2 = 0;
        (uVar1 = 0xffffffff, uVar2 != 0x20 &&
        (uVar1 = uVar2, ((uint)Supp >> (uVar2 & 0x1f) & 1) == 0)); uVar2 = uVar2 + 1) {
    }
    return uVar1;
  }
  __assert_fail("Supp > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0x567,"int Abc_TtSuppFindFirst(int)");
}

Assistant:

static inline int Abc_TtSuppFindFirst( int Supp )
{
    int i;
    assert( Supp > 0 );
    for ( i = 0; i < 32; i++ )
        if ( Supp & (1 << i) )
            return i;
    return -1;
}